

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator=(String *this,tagbstring *x)

{
  tagbstring *x_local;
  String *this_local;
  
  if ((this->super_tagbstring).mlen < 1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x133,"Write protection error");
  }
  if (x->slen < 0) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x134,"Failure in =(tagbstring) operator, badly formed tagbstring");
  }
  if ((this->super_tagbstring).mlen <= x->slen) {
    Alloc(this,x->slen);
  }
  (this->super_tagbstring).slen = x->slen;
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x13b,"Failure in =(tagbstring) operator");
  }
  else {
    memcpy((this->super_tagbstring).data,x->data,(long)(this->super_tagbstring).slen);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return this;
}

Assistant:

const String& String::operator=(const tagbstring& x)
    {
        if (mlen <= 0)    bstringThrow("Write protection error");
        if (x.slen < 0)    bstringThrow("Failure in =(tagbstring) operator, badly formed tagbstring");
        if (x.slen >= mlen)    Alloc(x.slen);

        slen = x.slen;
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in =(tagbstring) operator");
        }
        else
        {
            memcpy(data, x.data, slen);
            data[slen] = '\0';
        }
        return *this;
    }